

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int write_directory_descriptors(archive_write *a,vdd *vdd)

{
  iso9660_conflict *iso9660_00;
  size_t sVar1;
  isoent **ppiVar2;
  content_conflict *pcVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  isoent *piVar8;
  long lVar9;
  isofile *piVar10;
  isoent *isoent;
  extr_rec *peVar11;
  isoent *piVar12;
  int iVar13;
  int iVar14;
  iso9660_conflict *iso9660;
  uchar *p;
  uchar *puVar15;
  int local_74;
  int local_44;
  
  iVar14 = 0;
  isoent = vdd->rootent;
  do {
    iso9660_00 = (iso9660_conflict *)a->format_data;
    sVar1 = iso9660_00->wbuff_remaining;
    p = (uchar *)((long)iso9660_00 + (0x102dc - sVar1));
    iVar7 = set_directory_record(p,0x800,isoent,iso9660_00,DIR_REC_SELF,vdd->vdd_type);
    puVar15 = (uchar *)((long)iso9660_00 + ((long)iVar7 - sVar1) + 0x102dc);
    iVar7 = set_directory_record
                      (puVar15,0x800 - (long)iVar7,isoent,iso9660_00,DIR_REC_PARENT,vdd->vdd_type);
    puVar15 = puVar15 + iVar7;
    if ((0 < (isoent->children).cnt) &&
       (((vdd->vdd_type == VDD_JOLIET || ((*(ushort *)&(iso9660_00->opt).field_0x2 & 0x180) != 0))
        || (iVar14 + 1 < vdd->max_depth)))) {
      ppiVar2 = isoent->children_sorted;
      lVar9 = 0;
      do {
        piVar12 = ppiVar2[lVar9];
        piVar10 = piVar12->file->hardlink_target;
        if (piVar10 == (isofile *)0x0) {
          piVar10 = piVar12->file;
        }
        piVar10->cur_content = &piVar10->content;
        do {
          iVar7 = set_directory_record
                            (puVar15,(size_t)(p + (0x800 - (long)puVar15)),piVar12,iso9660_00,
                             DIR_REC_NORMAL,vdd->vdd_type);
          if (iVar7 == 0) {
            bVar5 = false;
            memset(puVar15,0,(size_t)(p + (0x800 - (long)puVar15)));
            iVar7 = wb_consume(a,0x800);
            if (iVar7 < 0) goto LAB_0050d512;
            puVar15 = (uchar *)((long)a->format_data +
                               (0x102dc - *(long *)((long)a->format_data + 0x102e0)));
            iVar7 = set_directory_record
                              (puVar15,0x800,piVar12,iso9660_00,DIR_REC_NORMAL,vdd->vdd_type);
            p = puVar15;
          }
          puVar15 = puVar15 + iVar7;
          pcVar3 = piVar10->cur_content->next;
          piVar10->cur_content = pcVar3;
        } while (pcVar3 != (content_conflict *)0x0);
        bVar5 = true;
        iVar7 = local_44;
LAB_0050d512:
        local_44 = iVar7;
        iVar7 = local_44;
        if (!bVar5) goto LAB_0050d579;
        lVar9 = lVar9 + 1;
      } while (lVar9 < (isoent->children).cnt);
    }
    memset(puVar15,0,(size_t)(p + (0x800 - (long)puVar15)));
    iVar7 = wb_consume(a,0x800);
LAB_0050d579:
    iVar13 = 1;
    piVar12 = isoent;
    iVar6 = iVar14;
    if (-1 < iVar7) {
      if (vdd->vdd_type != VDD_JOLIET) {
        for (peVar11 = (isoent->extr_rec_list).first; peVar11 != (extr_rec *)0x0;
            peVar11 = peVar11->next) {
          pvVar4 = a->format_data;
          lVar9 = *(long *)((long)pvVar4 + 0x102e0);
          memcpy((void *)((long)pvVar4 + (0x102dc - lVar9)),peVar11->buf,(long)peVar11->offset);
          memset((void *)((long)pvVar4 + (peVar11->offset - lVar9) + 0x102dc),0,
                 0x800 - (long)peVar11->offset);
          iVar7 = wb_consume(a,0x800);
          if (iVar7 < 0) goto LAB_0050d65a;
        }
      }
      piVar12 = (isoent->subdirs).first;
      iVar7 = local_74;
      if (piVar12 != (isoent *)0x0) {
        iVar13 = 3;
        iVar6 = iVar14 + 1;
        if (iVar14 + 1 < vdd->max_depth) goto LAB_0050d65a;
      }
      iVar13 = 0;
      piVar12 = isoent->parent;
      while ((piVar8 = piVar12, piVar12 = isoent, iVar6 = iVar14, isoent != piVar8 &&
             (piVar12 = isoent->drnext, piVar12 == (isoent *)0x0))) {
        iVar14 = iVar14 + -1;
        piVar12 = piVar8->parent;
        isoent = piVar8;
      }
    }
LAB_0050d65a:
    iVar14 = iVar6;
    local_74 = iVar7;
    if ((iVar13 != 3) && (iVar13 != 0)) {
      return local_74;
    }
    isoent = piVar12;
    if (piVar12 == piVar12->parent) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
write_directory_descriptors(struct archive_write *a, struct vdd *vdd)
{
	struct isoent *np;
	int depth, r;

	depth = 0;
	np = vdd->rootent;
	do {
		struct extr_rec *extr;

		r = _write_directory_descriptors(a, vdd, np, depth);
		if (r < 0)
			return (r);
		if (vdd->vdd_type != VDD_JOLIET) {
			/*
			 * This extract record is used by SUSP,RRIP.
			 * Not for joliet.
			 */
			for (extr = np->extr_rec_list.first;
			    extr != NULL;
			    extr = extr->next) {
				unsigned char *wb;

				wb = wb_buffptr(a);
				memcpy(wb, extr->buf, extr->offset);
				memset(wb + extr->offset, 0,
				    LOGICAL_BLOCK_SIZE - extr->offset);
				r = wb_consume(a, LOGICAL_BLOCK_SIZE);
				if (r < 0)
					return (r);
			}
		}

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);

	return (ARCHIVE_OK);
}